

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_HermiteSurface::IsValid(ON_HermiteSurface *this)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  ON_SimpleArray<ON_3dPoint> *pOVar4;
  ON_3dPoint *this_00;
  ON_SimpleArray<ON_3dVector> *pOVar5;
  ON_3dVector *pOVar6;
  ON_SimpleArray<double> *u_Parameters;
  ON_SimpleArray<double> *v_Parameters;
  ON_ClassArray<ON_SimpleArray<ON_3dPoint>_> *GridPoints;
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_> *u_Tangents;
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_> *v_Tangents;
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_> *TwistVectors;
  int local_40;
  int local_3c;
  int j_3;
  int i_5;
  int j_2;
  int i_4;
  int j_1;
  int i_3;
  int j;
  int i_2;
  int i_1;
  int i;
  ON_HermiteSurface *this_local;
  
  i_2 = 0;
  while( true ) {
    iVar2 = ON_SimpleArray<double>::Count(&this->m_u_parameters);
    if (iVar2 <= i_2) {
      j = 0;
      while( true ) {
        iVar2 = ON_SimpleArray<double>::Count(&this->m_v_parameters);
        if (iVar2 <= j) {
          i_3 = 0;
          do {
            iVar2 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::Count(&this->m_grid_points);
            if (iVar2 <= i_3) {
              i_4 = 0;
              do {
                iVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Count(&this->m_u_tangents);
                if (iVar2 <= i_4) {
                  i_5 = 0;
                  do {
                    iVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Count(&this->m_v_tangents);
                    if (iVar2 <= i_5) {
                      local_3c = 0;
                      do {
                        iVar2 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::Count(&this->m_twists);
                        if (iVar2 <= local_3c) {
                          u_Parameters = UParameters(this);
                          v_Parameters = VParameters(this);
                          GridPoints = ON_HermiteSurface::GridPoints(this);
                          u_Tangents = UTangents(this);
                          v_Tangents = VTangents(this);
                          TwistVectors = Twists(this);
                          bVar1 = ValidateHermiteData(u_Parameters,v_Parameters,GridPoints,
                                                      u_Tangents,v_Tangents,TwistVectors);
                          return bVar1;
                        }
                        local_40 = 0;
                        while( true ) {
                          pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[]
                                             (&this->m_twists,local_3c);
                          iVar2 = ON_SimpleArray<ON_3dVector>::Count(pOVar5);
                          if (iVar2 <= local_40) break;
                          pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[]
                                             (&this->m_twists,local_3c);
                          pOVar6 = ON_SimpleArray<ON_3dVector>::operator[](pOVar5,local_40);
                          bVar1 = ON_3dVector::IsUnset(pOVar6);
                          if (bVar1) {
                            return false;
                          }
                          local_40 = local_40 + 1;
                        }
                        local_3c = local_3c + 1;
                      } while( true );
                    }
                    j_3 = 0;
                    while( true ) {
                      pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[]
                                         (&this->m_v_tangents,i_5);
                      iVar2 = ON_SimpleArray<ON_3dVector>::Count(pOVar5);
                      if (iVar2 <= j_3) break;
                      pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[]
                                         (&this->m_v_tangents,i_5);
                      pOVar6 = ON_SimpleArray<ON_3dVector>::operator[](pOVar5,j_3);
                      bVar1 = ON_3dVector::IsUnset(pOVar6);
                      if (bVar1) {
                        return false;
                      }
                      j_3 = j_3 + 1;
                    }
                    i_5 = i_5 + 1;
                  } while( true );
                }
                j_2 = 0;
                while( true ) {
                  pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[]
                                     (&this->m_u_tangents,i_4);
                  iVar2 = ON_SimpleArray<ON_3dVector>::Count(pOVar5);
                  if (iVar2 <= j_2) break;
                  pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::operator[]
                                     (&this->m_u_tangents,i_4);
                  pOVar6 = ON_SimpleArray<ON_3dVector>::operator[](pOVar5,j_2);
                  bVar1 = ON_3dVector::IsUnset(pOVar6);
                  if (bVar1) {
                    return false;
                  }
                  j_2 = j_2 + 1;
                }
                i_4 = i_4 + 1;
              } while( true );
            }
            j_1 = 0;
            while( true ) {
              pOVar4 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::operator[]
                                 (&this->m_grid_points,i_3);
              iVar2 = ON_SimpleArray<ON_3dPoint>::Count(pOVar4);
              if (iVar2 <= j_1) break;
              pOVar4 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::operator[]
                                 (&this->m_grid_points,i_3);
              this_00 = ON_SimpleArray<ON_3dPoint>::operator[](pOVar4,j_1);
              bVar1 = ON_3dPoint::IsUnset(this_00);
              if (bVar1) {
                return false;
              }
              j_1 = j_1 + 1;
            }
            i_3 = i_3 + 1;
          } while( true );
        }
        pdVar3 = ON_SimpleArray<double>::operator[](&this->m_v_parameters,j);
        bVar1 = ON_IsValid(*pdVar3);
        if (!bVar1) break;
        j = j + 1;
      }
      return false;
    }
    pdVar3 = ON_SimpleArray<double>::operator[](&this->m_u_parameters,i_2);
    bVar1 = ON_IsValid(*pdVar3);
    if (!bVar1) break;
    i_2 = i_2 + 1;
  }
  return false;
}

Assistant:

bool ON_HermiteSurface::IsValid() const
{
  for (int i = 0; i < m_u_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_u_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_v_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_v_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_grid_points.Count(); i++)
  {
    for (int j = 0; j < m_grid_points[i].Count(); j++)
    {
      if (m_grid_points[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_u_tangents.Count(); i++)
  {
    for (int j = 0; j < m_u_tangents[i].Count(); j++)
    {
      if (m_u_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_v_tangents.Count(); i++)
  {
    for (int j = 0; j < m_v_tangents[i].Count(); j++)
    {
      if (m_v_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_twists.Count(); i++)
  {
    for (int j = 0; j < m_twists[i].Count(); j++)
    {
      if (m_twists[i][j].IsUnset())
        return false;
    }
  }
  
  return ValidateHermiteData(
    UParameters(),
    VParameters(),
    GridPoints(),
    UTangents(),
    VTangents(),
    Twists()
  );
}